

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_object.cpp
# Opt level: O1

wstring_view __thiscall
mjs::string_object::handle_array_like_access(string_object *this,wstring_view property_name)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  gc_string *pgVar4;
  gc_string *in_RCX;
  wstring_view wVar5;
  wstring_view local_28;
  
  local_28._M_str = property_name._M_str;
  local_28._M_len = property_name._M_len;
  pgVar4 = (gc_string *)0x0;
  uVar3 = 0;
  if (this->is_v5_or_later_ == true) {
    uVar2 = index_value_from_string(&local_28);
    bVar1 = true;
    if (uVar2 != 0xffffffff) {
      pgVar4 = gc_heap_ptr_untracked<mjs::gc_string,_true>::dereference
                         ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)
                          &(this->super_native_object).field_0x24,
                          (this->super_native_object).super_object.heap_);
      if (uVar2 < pgVar4->length_) {
        in_RCX = pgVar4 + (ulong)uVar2 + 1;
        bVar1 = false;
      }
    }
    pgVar4 = (gc_string *)0x0;
    if (!bVar1) {
      pgVar4 = in_RCX;
    }
    uVar3 = (ulong)(bVar1 ^ 1);
  }
  wVar5._M_str = (wchar_t *)pgVar4;
  wVar5._M_len = uVar3;
  return wVar5;
}

Assistant:

std::wstring_view handle_array_like_access(const std::wstring_view property_name) const {
        if (is_v5_or_later_) {
            if (const uint32_t index = index_value_from_string(property_name); index != invalid_index_value) {
                auto v = view();
                if (index < v.length()) {
                    return v.substr(index, 1);
                }
            }
        }
        return {};
    }